

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

void __thiscall
TPZFNMatrix<1,_Fad<double>_>::TPZFNMatrix
          (TPZFNMatrix<1,_Fad<double>_> *this,int64_t row,int64_t col,Fad<double> *val)

{
  TPZFMatrix<Fad<double>_> *pTVar1;
  Fad<double> *in_RCX;
  int64_t in_RDX;
  int64_t in_RSI;
  TPZFMatrix<Fad<double>_> *in_RDI;
  TPZFMatrix<Fad<double>_> *unaff_retaddr;
  Fad<double> *in_stack_ffffffffffffff60;
  Fad<double> *in_stack_ffffffffffffff68;
  Fad<double> *in_stack_ffffffffffffff70;
  TPZFMatrix<Fad<double>_> *local_68;
  int64_t sz;
  TPZFMatrix<Fad<double>_> *pTVar2;
  
  sz = 0;
  pTVar2 = in_RDI;
  TPZRegisterClassId::TPZRegisterClassId<TPZFNMatrix<1,Fad<double>>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  (in_RDI->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_024c44c8;
  TPZFMatrix<Fad<double>_>::TPZFMatrix(unaff_retaddr,(void **)pTVar2,in_RSI,in_RDX,in_RCX,sz);
  (in_RDI->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_024c44c8;
  pTVar2 = in_RDI + 1;
  pTVar1 = in_RDI + 1;
  do {
    local_68 = pTVar1;
    Fad<double>::Fad(in_stack_ffffffffffffff70);
    pTVar1 = (TPZFMatrix<Fad<double>_> *)&local_68->fElem;
  } while (&local_68->fElem != (Fad<double> **)&(pTVar2->fPivot).super_TPZVec<int>.fStore);
  Fad<double>::Fad(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  TPZFMatrix<Fad<double>_>::operator=(in_RDI,(Fad<double> *)local_68);
  Fad<double>::~Fad(in_stack_ffffffffffffff60);
  return;
}

Assistant:

inline  TPZFNMatrix(int64_t row, int64_t col, const TVar &val) : TPZRegisterClassId(&TPZFNMatrix<N,TVar>::ClassId), 
    TPZFMatrix<TVar>(row,col,fBuf,N) {
        TPZFMatrix<TVar>::operator=(val);
    }